

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::ThreadPool::worker::operator()(worker *this)

{
  bool bVar1;
  function<void_()> *in_RDI;
  unique_lock<std::mutex> lock;
  function<void_()> fn;
  mutex_type *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar2;
  function<void_()> *in_stack_ffffffffffffffb8;
  function<void_()> *in_stack_ffffffffffffffc0;
  
  while( true ) {
    std::function<void_()>::function(in_RDI);
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)in_RDI,in_stack_ffffffffffffff98);
    std::condition_variable::operator()
              ((condition_variable *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (unique_lock<std::mutex> *)in_RDI,(anon_class_8_1_8991fb9c)in_RDI);
    if (((*(byte *)(*(long *)&(in_RDI->super__Function_base)._M_functor + 0x38) & 1) == 0) ||
       (bVar1 = std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                ::empty((list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                        (*(long *)&(in_RDI->super__Function_base)._M_functor + 0x20)), !bVar1)) {
      std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::front
                ((list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)in_RDI);
      std::function<void_()>::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
      pop_front((list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)in_RDI);
      iVar2 = 0;
    }
    else {
      iVar2 = 2;
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_RDI);
    if (iVar2 == 0) {
      std::function<void_()>::operator()(in_RDI);
      iVar2 = 0;
    }
    std::function<void_()>::~function((function<void_()> *)0x17388c);
    if (iVar2 != 0) break;
    in_stack_ffffffffffffffac = 0;
  }
  return;
}

Assistant:

void operator()() {
      for (;;) {
        std::function<void()> fn;
        {
          std::unique_lock<std::mutex> lock(pool_.mutex_);

          pool_.cond_.wait(
              lock, [&] { return !pool_.jobs_.empty() || pool_.shutdown_; });

          if (pool_.shutdown_ && pool_.jobs_.empty()) { break; }

          fn = std::move(pool_.jobs_.front());
          pool_.jobs_.pop_front();
        }

        assert(true == static_cast<bool>(fn));
        fn();
      }
    }